

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O0

int __thiscall
FPCXTexture::CopyTrueColorPixels
          (FPCXTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  undefined4 local_5e8 [2];
  uint local_5e0;
  int local_5d8;
  undefined8 local_5d0;
  FCopyInfo *local_5c8;
  undefined4 local_5c0;
  undefined4 local_5b8;
  undefined4 local_5b0;
  FResourceLump *local_5a0;
  undefined1 *local_598;
  FResourceLump *local_590;
  FileReader *local_588;
  FileReader *local_580;
  uint local_574;
  FResourceLump *local_570;
  FWadLump *local_568;
  BYTE *local_560;
  FPCXTexture *local_558;
  PalEntry *local_550;
  BYTE *local_548;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_53c;
  BYTE local_537;
  BYTE local_536;
  BYTE local_535;
  int local_534;
  BYTE b;
  BYTE g;
  BYTE r;
  int i_2;
  BYTE local_525;
  int i_1;
  int iStack_520;
  BYTE c;
  int i;
  undefined1 local_510 [8];
  FWadLump lump;
  BYTE *Pixels;
  undefined1 local_4c8 [4];
  int bitcount;
  PCXHeader header;
  PalEntry pe [256];
  FCopyInfo *inf_local;
  int rotate_local;
  int y_local;
  int x_local;
  FBitmap *bmp_local;
  FPCXTexture *this_local;
  
  local_548 = header.padding + 0x2e;
  local_550 = pe + 0xfe;
  local_558 = this;
  do {
    local_560 = local_548;
    PalEntry::PalEntry((PalEntry *)local_548);
    local_548 = local_560 + 4;
  } while ((PalEntry *)local_548 != local_550);
  local_568 = (FWadLump *)local_510;
  FWadCollection::OpenLumpNum(local_568,&Wads,(local_558->super_FTexture).SourceLump);
  FWadLump::Read(local_568,local_4c8,0x80);
  uVar2 = (uint)local_4c8[3] * (uint)header.palette[0x29];
  local_5d8 = rotate;
  local_5c8 = inf;
  if (uVar2 < 0x18) {
    local_570 = (FResourceLump *)
                operator_new__((long)(int)((uint)(local_558->super_FTexture).Width *
                                          (uint)(local_558->super_FTexture).Height));
    lump.Lump = local_570;
    if (uVar2 < 8) {
      for (iStack_520 = 0; iStack_520 < 0x10; iStack_520 = iStack_520 + 1) {
        lVar3 = (long)(iStack_520 * 3);
        PalEntry::PalEntry((PalEntry *)&i_1,header.palette[lVar3 + -8],header.palette[lVar3 + -7],
                           header.palette[lVar3 + -6]);
        pe[(long)iStack_520 + -2].field_0.d = i_1;
      }
      local_574 = uVar2;
      if ((uVar2 == 1) || (uVar2 != 4)) {
        ReadPCX1bit(local_558,(BYTE *)lump.Lump,(FileReader *)local_510,(PCXHeader *)local_4c8);
      }
      else {
        ReadPCX4bits(local_558,(BYTE *)lump.Lump,(FileReader *)local_510,(PCXHeader *)local_4c8);
      }
    }
    else if (uVar2 == 8) {
      FWadLump::Seek((FWadLump *)local_510,-0x301,2);
      FileReader::operator>>((FileReader *)local_510,&local_525);
      local_525 = '\f';
      for (local_534 = 0; local_534 < 0x100; local_534 = local_534 + 1) {
        local_580 = FileReader::operator>>((FileReader *)local_510,&local_535);
        local_588 = FileReader::operator>>(local_580,&local_536);
        FileReader::operator>>(local_588,&local_537);
        PalEntry::PalEntry((PalEntry *)&local_53c.field_0,0xff,local_535,local_536,local_537);
        pe[(long)local_534 + -2].field_0 = local_53c;
      }
      FWadLump::Seek((FWadLump *)local_510,0x80,0);
      ReadPCX8bits(local_558,(BYTE *)lump.Lump,(FileReader *)local_510,(PCXHeader *)local_4c8);
    }
    uVar1 = (local_558->super_FTexture).Width;
    local_5d0 = header.padding + 0x2e;
    local_5e0 = (uint)uVar1;
    local_5e8[0] = 1;
    (*bmp->_vptr_FBitmap[3])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,lump.Lump,(ulong)uVar1,
               (ulong)(local_558->super_FTexture).Height);
  }
  else {
    local_590 = (FResourceLump *)
                operator_new__((long)(int)((uint)(local_558->super_FTexture).Width *
                                           (uint)(local_558->super_FTexture).Height * 3));
    lump.Lump = local_590;
    ReadPCX24bits(local_558,(BYTE *)local_590,(FileReader *)local_510,(PCXHeader *)local_4c8,3);
    uVar1 = (local_558->super_FTexture).Width;
    local_5e0 = (uint)uVar1 + (uint)uVar1 * 2;
    local_5b0 = 0;
    local_5b8 = 0;
    local_5c0 = 0;
    local_5d0 = (BYTE *)((ulong)local_5d0._4_4_ << 0x20);
    local_5e8[0] = 3;
    local_598 = (undefined1 *)local_5e8;
    (*bmp->_vptr_FBitmap[2])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,lump.Lump,(ulong)uVar1,
               (ulong)(local_558->super_FTexture).Height);
  }
  local_5a0 = lump.Lump;
  if (lump.Lump != (FResourceLump *)0x0) {
    operator_delete__(lump.Lump);
  }
  FWadLump::~FWadLump((FWadLump *)local_510);
  return 0;
}

Assistant:

int FPCXTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];
	PCXHeader header;
	int bitcount;
	BYTE * Pixels;

	FWadLump lump = Wads.OpenLumpNum(SourceLump);

	lump.Read(&header, sizeof(header));

	bitcount = header.bitsPerPixel * header.numColorPlanes;

	if (bitcount < 24)
	{
		Pixels = new BYTE[Width*Height];
		if (bitcount < 8)
		{
			for (int i=0;i<16;i++)
			{
				pe[i] = PalEntry(header.palette[i*3],header.palette[i*3+1],header.palette[i*3+2]);
			}

			switch (bitcount)
			{
			default:
			case 1:
				ReadPCX1bit (Pixels, lump, &header);
				break;

			case 4:
				ReadPCX4bits (Pixels, lump, &header);
				break;
			}
		}
		else if (bitcount == 8)
		{
			BYTE c;
			lump.Seek(-769, SEEK_END);
			lump >> c;
			c=0x0c;	// Apparently there's many non-compliant PCXs out there...
			if (c !=0x0c) 
			{
				for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// default to a gray map
			}
			else for(int i=0;i<256;i++)
			{
				BYTE r,g,b;
				lump >> r >> g >> b;
				pe[i] = PalEntry(255, r,g,b);
			}
			lump.Seek(sizeof(header), SEEK_SET);
			ReadPCX8bits (Pixels, lump, &header);
		}
		bmp->CopyPixelData(x, y, Pixels, Width, Height, 1, Width, rotate, pe, inf);
	}
	else
	{
		Pixels = new BYTE[Width*Height * 3];
		ReadPCX24bits (Pixels, lump, &header, 3);
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, Width*3, rotate, CF_RGB, inf);
	}
	delete [] Pixels;
	return 0;
}